

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::ParseHierarchyChunk(Discreet3DSImporter *this,uint16_t parent)

{
  pointer *pppNVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  pointer *ppaVar4;
  StreamReader<false,_false> *this_00;
  int8_t *piVar5;
  iterator __position;
  iterator iVar6;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_> _Var7;
  aiVectorKey *paVar8;
  iterator __position_00;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> __seed;
  aiQuatKey *paVar9;
  iterator iVar10;
  double dVar11;
  ai_real aVar12;
  undefined4 uVar13;
  char cVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  Node *pNVar18;
  long lVar19;
  aiFloatKey *paVar20;
  Logger *pLVar21;
  Node *this_01;
  pointer paVar22;
  double *pdVar23;
  pointer paVar24;
  pointer paVar25;
  uint uVar26;
  pointer paVar27;
  double *pdVar28;
  pointer paVar29;
  pointer paVar30;
  pointer paVar31;
  pointer paVar32;
  double *pdVar33;
  double *pdVar34;
  pointer paVar35;
  pointer paVar36;
  pointer paVar37;
  pointer paVar38;
  bool bVar39;
  int32_t iVar40;
  ulong uVar41;
  undefined6 in_register_00000032;
  char *pcVar42;
  ushort uVar43;
  vector<aiVectorKey,std::allocator<aiVectorKey>> *this_02;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined4 extraout_XMM0_Db;
  float fVar47;
  float fVar48;
  pair<Assimp::D3DS::aiFloatKey_*,_long> pVar49;
  aiVectorKey v;
  Chunk chunk;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined1 local_a8 [26];
  Chunk local_8e;
  uint local_88;
  float local_84;
  Node *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  uint local_60;
  float local_5c;
  float local_58;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  long local_38;
  
  local_88 = (uint)CONCAT62(in_register_00000032,parent);
  local_38 = 0x88;
  if ((local_88 & 0xfffffffd) == 0xb004) {
    local_38 = 0xb8;
  }
  uVar26 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  do {
    if (uVar26 < 6) {
      return;
    }
    ReadChunk(this,&local_8e);
    if (0 < (int)(local_8e.Size - 6)) {
      this_00 = this->stream;
      local_60 = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_8e.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
      if (0xb01f < local_8e.Flag) {
        switch(local_8e.Flag) {
        case 0xb020:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
          this_02 = (vector<aiVectorKey,std::allocator<aiVectorKey>> *)
                    ((long)&this->mCurrentNode->mParent + local_38);
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
                    ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_02,(ulong)uVar26);
          if (uVar26 != 0) {
            bVar39 = false;
            do {
              uVar16 = StreamReader<false,_false>::Get<int>(this->stream);
              uStack_b0 = 0;
              local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
              local_b8 = (undefined1  [8])(double)uVar16;
              SkipTCBInfo(this);
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              uStack_b0 = CONCAT44(uStack_b0._4_4_,fVar44);
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              uStack_b0 = CONCAT44(fVar44,(float)uStack_b0);
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              local_a8._0_4_ = fVar44;
              iVar6._M_current = *(aiVectorKey **)(this_02 + 8);
              if ((*(aiVectorKey **)this_02 != iVar6._M_current) &&
                 ((double)local_b8 <= iVar6._M_current[-1].mTime)) {
                bVar39 = true;
              }
              if (iVar6._M_current == *(aiVectorKey **)(this_02 + 0x10)) {
                std::vector<aiVectorKey,std::allocator<aiVectorKey>>::
                _M_realloc_insert<aiVectorKey_const&>(this_02,iVar6,(aiVectorKey *)local_b8);
              }
              else {
                *(undefined8 *)&((iVar6._M_current)->mValue).z = local_a8._0_8_;
                (iVar6._M_current)->mTime = (double)local_b8;
                ((iVar6._M_current)->mValue).x = (float)uStack_b0;
                ((iVar6._M_current)->mValue).y = uStack_b0._4_4_;
                *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x18;
              }
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
            if (bVar39) {
              _Var7._M_current = *(aiVectorKey **)this_02;
              paVar8 = *(aiVectorKey **)(this_02 + 8);
              if (_Var7._M_current != paVar8) {
                lVar19 = ((long)paVar8 - (long)_Var7._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                                     *)local_b8,_Var7,(lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
                if ((pointer)local_a8._0_8_ == (pointer)0x0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8,local_a8._0_8_,uStack_b0);
                }
                operator_delete((void *)local_a8._0_8_,uStack_b0 * 0x18);
              }
              pdVar23 = *(double **)(this_02 + 8);
              pdVar28 = pdVar23;
              if (*(double **)this_02 != pdVar23) {
                pdVar34 = *(double **)this_02 + 3;
                do {
                  pdVar33 = pdVar34;
                  if (pdVar33 == pdVar23) goto LAB_003fc5bf;
                  pdVar34 = pdVar33 + 3;
                } while ((pdVar33[-3] != *pdVar33) || (NAN(pdVar33[-3]) || NAN(*pdVar33)));
                pdVar28 = pdVar33 + -3;
              }
LAB_003fc5bf:
              if (pdVar28 != pdVar23) {
                for (pdVar34 = pdVar28 + 6; pdVar34 != pdVar23; pdVar34 = pdVar34 + 3) {
                  if ((*pdVar28 != *pdVar34) || (NAN(*pdVar28) || NAN(*pdVar34))) {
                    *(undefined4 *)(pdVar28 + 5) = *(undefined4 *)(pdVar34 + 2);
                    dVar11 = pdVar34[1];
                    pdVar28[3] = *pdVar34;
                    pdVar28[4] = dVar11;
                    pdVar28 = pdVar28 + 3;
                  }
                }
                pdVar23 = pdVar28 + 3;
              }
              if ((pdVar23 != *(double **)(this_02 + 8)) &&
                 (lVar19 = (long)pdVar23 +
                           (*(long *)(this_02 + 8) - (long)*(double **)(this_02 + 8)),
                 *(long *)(this_02 + 8) != lVar19)) {
                *(long *)(this_02 + 8) = lVar19;
              }
            }
          }
          break;
        case 0xb021:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
          pNVar18 = this->mCurrentNode;
          std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve
                    (&pNVar18->aRotationKeys,(ulong)uVar26);
          if (uVar26 != 0) {
            bVar39 = false;
            do {
              uVar16 = StreamReader<false,_false>::Get<int>(this->stream);
              SkipTCBInfo(this);
              uStack_b0 = 0x3f800000;
              local_a8._0_8_ = (pointer)0x0;
              local_b8 = (undefined1  [8])(double)uVar16;
              local_84 = StreamReader<false,_false>::Get<float>(this->stream);
              local_78 = StreamReader<false,_false>::Get<float>(this->stream);
              fStack_74 = (float)extraout_XMM0_Db;
              local_58 = StreamReader<false,_false>::Get<float>(this->stream);
              local_48 = local_78;
              uStack_40 = fStack_74;
              fStack_44 = local_58;
              fVar45 = StreamReader<false,_false>::Get<float>(this->stream);
              fVar46 = local_48;
              fVar44 = fStack_44;
              if ((fVar45 == 0.0) && (!NAN(fVar45))) {
                fVar44 = 1.0;
                fVar46 = local_78;
              }
              fVar47 = local_48;
              fVar48 = fStack_44;
              if ((local_58 == 0.0) && (!NAN(local_58))) {
                fVar47 = fVar46;
                fVar48 = fVar44;
              }
              if ((local_78 == 0.0) && (!NAN(local_78))) {
                local_48 = fVar47;
                fStack_44 = fVar48;
              }
              fVar44 = fVar45 * fVar45 + local_48 * local_48 + fStack_44 * fStack_44;
              local_58 = fVar45;
              local_78 = fStack_44;
              fStack_74 = fStack_44;
              fStack_70 = fStack_44;
              fStack_6c = fStack_44;
              if (fVar44 < 0.0) {
                fVar44 = sqrtf(fVar44);
              }
              else {
                fVar44 = SQRT(fVar44);
              }
              fVar44 = 1.0 / fVar44;
              local_48 = local_48 * fVar44;
              local_78 = local_78 * fVar44;
              local_58 = local_58 * fVar44;
              local_84 = local_84 * 0.5;
              local_5c = sinf(local_84);
              fVar44 = cosf(local_84);
              uStack_b0 = CONCAT44(local_48 * local_5c,fVar44);
              local_a8._4_4_ = local_58 * local_5c;
              local_a8._0_4_ = local_78 * local_5c;
              __position_00._M_current =
                   (pNVar18->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (((pNVar18->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_start != __position_00._M_current) &&
                 ((double)local_b8 <= __position_00._M_current[-1].mTime)) {
                bVar39 = true;
              }
              if (__position_00._M_current ==
                  (pNVar18->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiQuatKey,std::allocator<aiQuatKey>>::
                _M_realloc_insert<aiQuatKey_const&>
                          ((vector<aiQuatKey,std::allocator<aiQuatKey>> *)&pNVar18->aRotationKeys,
                           __position_00,(aiQuatKey *)local_b8);
              }
              else {
                ((__position_00._M_current)->mValue).y = local_78 * local_5c;
                ((__position_00._M_current)->mValue).z = local_58 * local_5c;
                (__position_00._M_current)->mTime = (double)local_b8;
                ((__position_00._M_current)->mValue).w = fVar44;
                ((__position_00._M_current)->mValue).x = local_48 * local_5c;
                ppaVar2 = &(pNVar18->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppaVar2 = *ppaVar2 + 1;
              }
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
            if (bVar39) {
              __seed._M_current =
                   (pNVar18->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
              paVar9 = (pNVar18->aRotationKeys).
                       super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (__seed._M_current != paVar9) {
                lVar19 = ((long)paVar9 - (long)__seed._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>,_aiQuatKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>,_aiQuatKey>
                                     *)local_b8,__seed,(lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
                if ((pointer)local_a8._0_8_ == (pointer)0x0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (__seed._M_current,paVar9);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,aiQuatKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (__seed._M_current,paVar9,local_a8._0_8_,uStack_b0);
                }
                operator_delete((void *)local_a8._0_8_,uStack_b0 * 0x18);
              }
              paVar36 = (pNVar18->aRotationKeys).
                        super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                        super__Vector_impl_data._M_start;
              paVar24 = (pNVar18->aRotationKeys).
                        super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              paVar29 = paVar24;
              if (paVar36 != paVar24) {
                paVar36 = paVar36 + 1;
                do {
                  paVar35 = paVar36;
                  if (paVar35 == paVar24) goto LAB_003fc684;
                  paVar36 = paVar35 + 1;
                } while ((paVar35[-1].mTime != paVar35->mTime) ||
                        (NAN(paVar35[-1].mTime) || NAN(paVar35->mTime)));
                paVar29 = paVar35 + -1;
              }
LAB_003fc684:
              if (paVar29 != paVar24) {
                for (paVar36 = paVar29 + 2; paVar36 != paVar24; paVar36 = paVar36 + 1) {
                  if ((paVar29->mTime != paVar36->mTime) ||
                     (NAN(paVar29->mTime) || NAN(paVar36->mTime))) {
                    fVar44 = (paVar36->mValue).z;
                    paVar29[1].mValue.y = (paVar36->mValue).y;
                    paVar29[1].mValue.z = fVar44;
                    fVar44 = (paVar36->mValue).w;
                    fVar46 = (paVar36->mValue).x;
                    paVar29[1].mTime = paVar36->mTime;
                    paVar29[1].mValue.w = fVar44;
                    paVar29[1].mValue.x = fVar46;
                    paVar29 = paVar29 + 1;
                  }
                }
                paVar24 = paVar29 + 1;
              }
              paVar36 = (pNVar18->aRotationKeys).
                        super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if ((paVar24 != paVar36) &&
                 (paVar29 = (pNVar18->aRotationKeys).
                            super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                 paVar24 = (pointer)((long)paVar24 + ((long)paVar29 - (long)paVar36)),
                 paVar29 != paVar24)) {
                (pNVar18->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                _M_impl.super__Vector_impl_data._M_finish = paVar24;
              }
            }
          }
          break;
        case 0xb022:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          sVar15 = StreamReader<false,_false>::Get<short>(this->stream);
          uVar41 = (ulong)(uint)(int)sVar15;
          StreamReader<false,_false>::IncPtr(this->stream,2);
          pNVar18 = this->mCurrentNode;
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
                    (&pNVar18->aScalingKeys,uVar41);
          if (sVar15 != 0) {
            bVar39 = false;
            do {
              uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
              SkipTCBInfo(this);
              uStack_b0 = 0;
              local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
              local_b8 = (undefined1  [8])(double)uVar26;
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              uStack_b0 = CONCAT44(uStack_b0._4_4_,fVar44);
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              uStack_b0 = CONCAT44(fVar44,(float)uStack_b0);
              fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
              local_a8._0_4_ = fVar44;
              paVar32 = (pNVar18->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (((pNVar18->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start != paVar32) &&
                 ((double)local_b8 <= paVar32[-1].mTime)) {
                bVar39 = true;
              }
              if (((float)uStack_b0 == 0.0) && (!NAN((float)uStack_b0))) {
                uStack_b0 = CONCAT44(uStack_b0._4_4_,0x3f800000);
              }
              if ((uStack_b0._4_4_ == 0.0) && (!NAN(uStack_b0._4_4_))) {
                uStack_b0 = CONCAT44(0x3f800000,(float)uStack_b0);
              }
              if ((fVar44 == 0.0) && (!NAN(fVar44))) {
                local_a8._0_4_ = 0x3f800000;
              }
              iVar6._M_current =
                   (pNVar18->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (pNVar18->aScalingKeys).
                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVectorKey,std::allocator<aiVectorKey>>::
                _M_realloc_insert<aiVectorKey_const&>
                          ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pNVar18->aScalingKeys
                           ,iVar6,(aiVectorKey *)local_b8);
              }
              else {
                *(undefined8 *)&((iVar6._M_current)->mValue).z = local_a8._0_8_;
                (iVar6._M_current)->mTime = (double)local_b8;
                ((iVar6._M_current)->mValue).x = (float)uStack_b0;
                ((iVar6._M_current)->mValue).y = uStack_b0._4_4_;
                ppaVar4 = &(pNVar18->aScalingKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppaVar4 = *ppaVar4 + 1;
              }
              uVar26 = (int)uVar41 - 1;
              uVar41 = (ulong)uVar26;
            } while (uVar26 != 0);
            if (bVar39) {
              _Var7._M_current =
                   (pNVar18->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
              paVar8 = (pNVar18->aScalingKeys).
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (_Var7._M_current != paVar8) {
                lVar19 = ((long)paVar8 - (long)_Var7._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                                     *)local_b8,_Var7,(lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
                if ((pointer)local_a8._0_8_ == (pointer)0x0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8,local_a8._0_8_,uStack_b0);
                }
                operator_delete((void *)local_a8._0_8_,uStack_b0 * 0x18);
              }
              paVar32 = (pNVar18->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_start;
              paVar22 = (pNVar18->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              paVar27 = paVar22;
              if (paVar32 != paVar22) {
                paVar32 = paVar32 + 1;
                do {
                  paVar31 = paVar32;
                  if (paVar31 == paVar22) goto LAB_003fc4f0;
                  paVar32 = paVar31 + 1;
                } while ((paVar31[-1].mTime != paVar31->mTime) ||
                        (NAN(paVar31[-1].mTime) || NAN(paVar31->mTime)));
                paVar27 = paVar31 + -1;
              }
LAB_003fc4f0:
              if (paVar27 != paVar22) {
                for (paVar32 = paVar27 + 2; paVar32 != paVar22; paVar32 = paVar32 + 1) {
                  if ((paVar27->mTime != paVar32->mTime) ||
                     (NAN(paVar27->mTime) || NAN(paVar32->mTime))) {
                    paVar27[1].mValue.z = (paVar32->mValue).z;
                    fVar44 = (paVar32->mValue).x;
                    fVar46 = (paVar32->mValue).y;
                    paVar27[1].mTime = paVar32->mTime;
                    paVar27[1].mValue.x = fVar44;
                    paVar27[1].mValue.y = fVar46;
                    paVar27 = paVar27 + 1;
                  }
                }
                paVar22 = paVar27 + 1;
              }
              paVar32 = (pNVar18->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if ((paVar22 != paVar32) &&
                 (paVar27 = (pNVar18->aScalingKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                 paVar22 = (pointer)((long)paVar22 + ((long)paVar27 - (long)paVar32)),
                 paVar27 != paVar22)) {
                (pNVar18->aScalingKeys).
                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                super__Vector_impl_data._M_finish = paVar22;
              }
            }
          }
          break;
        case 0xb023:
          pLVar21 = DefaultLogger::get();
          Logger::error(pLVar21,"3DS: Skipping FOV animation track. This is not supported");
          break;
        case 0xb024:
          if ((short)local_88 == -0x4ffd) {
            pNVar18 = this->mCurrentNode;
            StreamReader<false,_false>::IncPtr(this->stream,10);
            uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
            std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
            reserve(&pNVar18->aCameraRollKeys,(ulong)uVar26);
            if (uVar26 != 0) {
              bVar39 = false;
              do {
                uVar16 = StreamReader<false,_false>::Get<int>(this->stream);
                local_b8 = (undefined1  [8])(double)uVar16;
                SkipTCBInfo(this);
                fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
                uStack_b0 = CONCAT44(uStack_b0._4_4_,fVar44);
                __position._M_current =
                     (pNVar18->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (((pNVar18->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_start != __position._M_current) &&
                   ((double)local_b8 <= __position._M_current[-1].mTime)) {
                  bVar39 = true;
                }
                if (__position._M_current ==
                    (pNVar18->aCameraRollKeys).
                    super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>::
                  _M_realloc_insert<Assimp::D3DS::aiFloatKey_const&>
                            ((vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>
                              *)&pNVar18->aCameraRollKeys,__position,(aiFloatKey *)local_b8);
                }
                else {
                  (__position._M_current)->mTime = (double)local_b8;
                  *(size_type *)&(__position._M_current)->mValue = uStack_b0;
                  ppaVar3 = &(pNVar18->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar3 = *ppaVar3 + 1;
                }
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
              if (bVar39) {
                paVar38 = (pNVar18->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar25 = (pNVar18->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (paVar38 != paVar25) {
                  lVar19 = (long)paVar25 - (long)paVar38 >> 4;
                  pVar49 = std::get_temporary_buffer<Assimp::D3DS::aiFloatKey>
                                     ((lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
                  lVar19 = pVar49.second;
                  paVar20 = pVar49.first;
                  if (paVar20 == (aiFloatKey *)0x0) {
                    std::
                    __inplace_stable_sort<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (paVar38,paVar25);
                    lVar19 = 0;
                  }
                  else {
                    std::
                    __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,Assimp::D3DS::aiFloatKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                              (paVar38,paVar25,paVar20,lVar19);
                  }
                  operator_delete(paVar20,lVar19 << 4);
                }
                paVar38 = (pNVar18->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar25 = (pNVar18->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                paVar30 = paVar25;
                if (paVar38 != paVar25) {
                  paVar38 = paVar38 + 1;
                  do {
                    paVar37 = paVar38;
                    if (paVar37 == paVar25) goto LAB_003fc74c;
                    paVar38 = paVar37 + 1;
                  } while ((paVar37[-1].mTime != paVar37->mTime) ||
                          (NAN(paVar37[-1].mTime) || NAN(paVar37->mTime)));
                  paVar30 = paVar37 + -1;
                }
LAB_003fc74c:
                if (paVar30 != paVar25) {
                  for (paVar38 = paVar30 + 2; paVar38 != paVar25; paVar38 = paVar38 + 1) {
                    if ((paVar30->mTime != paVar38->mTime) ||
                       (NAN(paVar30->mTime) || NAN(paVar38->mTime))) {
                      aVar12 = paVar38->mValue;
                      uVar13 = *(undefined4 *)&paVar38->field_0xc;
                      paVar30[1].mTime = paVar38->mTime;
                      paVar30[1].mValue = aVar12;
                      *(undefined4 *)&paVar30[1].field_0xc = uVar13;
                      paVar30 = paVar30 + 1;
                    }
                  }
                  paVar25 = paVar30 + 1;
                }
                paVar38 = (pNVar18->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if ((paVar25 != paVar38) &&
                   (paVar30 = (pNVar18->aCameraRollKeys).
                              super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                   paVar25 = (pointer)((long)paVar25 + ((long)paVar30 - (long)paVar38)),
                   paVar30 != paVar25)) {
                  (pNVar18->aCameraRollKeys).
                  super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                  ._M_impl.super__Vector_impl_data._M_finish = paVar25;
                }
              }
            }
          }
          else {
            pLVar21 = DefaultLogger::get();
            pcVar42 = "3DS: Ignoring roll track for non-camera object";
LAB_003fc320:
            Logger::warn(pLVar21,pcVar42);
          }
        }
        goto switchD_003fba89_default;
      }
      if (local_8e.Flag == 0xb010) {
        piVar5 = this->stream->current;
        uVar41 = 0xffffffff;
        do {
          cVar14 = StreamReader<false,_false>::Get<signed_char>(this->stream);
          uVar41 = (ulong)((int)uVar41 + 1);
        } while (cVar14 != '\0');
        local_b8 = (undefined1  [8])local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,piVar5,piVar5 + uVar41);
        pNVar18 = FindNode(this->mRootNode,(string *)local_b8);
        if (pNVar18 == (Node *)0x0) {
          iVar40 = 1;
        }
        else {
          if ((short)local_88 != -0x4ffe) {
            this->mCurrentNode = pNVar18;
            goto LAB_003fc42f;
          }
          iVar40 = pNVar18->mInstanceCount + 1;
          pNVar18->mInstanceCount = iVar40;
        }
        this_01 = (Node *)operator_new(0xf8);
        D3DS::Node::Node(this_01,(string *)local_b8);
        this_01->mInstanceNumber = iVar40;
        StreamReader<false,_false>::IncPtr(this->stream,4);
        sVar15 = StreamReader<false,_false>::Get<short>(this->stream);
        uVar43 = sVar15 + 1;
        this_01->mHierarchyPos = uVar43;
        sVar15 = this->mLastNodeIndex;
        this_01->mHierarchyIndex = sVar15;
        pNVar18 = this->mCurrentNode;
        if ((pNVar18 == (Node *)0x0) || ((int)pNVar18->mHierarchyPos != (uint)uVar43)) {
          if ((int)(uint)uVar43 < (int)sVar15) {
            InverseNodeSearch(this,this_01,pNVar18);
            goto LAB_003fc411;
          }
          iVar10._M_current =
               (pNVar18->mChildren).
               super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pNVar18->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80 = this_01;
            std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
            _M_realloc_insert<Assimp::D3DS::Node*const&>
                      ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                       &pNVar18->mChildren,iVar10,&local_80);
          }
          else {
            *iVar10._M_current = this_01;
            pppNVar1 = &(pNVar18->mChildren).
                        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
            local_80 = this_01;
          }
          local_80->mParent = pNVar18;
        }
        else {
          pNVar18 = pNVar18->mParent;
          iVar10._M_current =
               (pNVar18->mChildren).
               super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pNVar18->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80 = this_01;
            std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
            _M_realloc_insert<Assimp::D3DS::Node*const&>
                      ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                       &pNVar18->mChildren,iVar10,&local_80);
          }
          else {
            *iVar10._M_current = this_01;
            pppNVar1 = &(pNVar18->mChildren).
                        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppNVar1 = *pppNVar1 + 1;
            local_80 = this_01;
          }
          local_80->mParent = pNVar18;
LAB_003fc411:
          uVar43 = (short)*(undefined4 *)&this->mLastNodeIndex + 1;
        }
        this->mLastNodeIndex = uVar43;
        this->mCurrentNode = this_01;
LAB_003fc42f:
        if (local_b8 != (undefined1  [8])local_a8) {
          operator_delete((void *)local_b8,(ulong)(local_a8._0_8_ + 1));
        }
      }
      else if (local_8e.Flag == 0xb011) {
        pcVar42 = this->stream->current;
        do {
          cVar14 = StreamReader<false,_false>::Get<signed_char>(this->stream);
        } while (cVar14 != '\0');
        iVar17 = std::__cxx11::string::compare((char *)&this->mCurrentNode->mName);
        if (iVar17 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b8,pcVar42,(allocator<char> *)&local_80);
          std::__cxx11::string::operator=((string *)&this->mCurrentNode->mName,(string *)local_b8);
          goto LAB_003fc42f;
        }
      }
      else if (local_8e.Flag == 0xb013) {
        if ((short)local_88 != -0x4ffe) {
          pLVar21 = DefaultLogger::get();
          pcVar42 = "3DS: Skipping pivot subchunk for non usual object";
          goto LAB_003fc320;
        }
        fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).x = fVar44;
        fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).y = fVar44;
        fVar44 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).z = fVar44;
      }
switchD_003fba89_default:
      this->stream->current = this->stream->limit;
      StreamReader<false,_false>::SetReadLimit(this->stream,local_60);
      if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
        return;
      }
    }
    uVar26 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseHierarchyChunk(uint16_t parent)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRACKOBJNAME:

        // This is the name of the object to which the track applies. The chunk also
        // defines the position of this object in the hierarchy.
        {

        // First of all: get the name of the object
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        while (stream->GetI1())++cnt;
        std::string name = std::string(sz,cnt);

        // Now find out whether we have this node already (target animation channels
        // are stored with a separate object ID)
        D3DS::Node* pcNode = FindNode(mRootNode,name);
        int instanceNumber = 1;

        if ( pcNode)
        {
            // if the source is not a CHUNK_TRACKINFO block it won't be an object instance
            if (parent != Discreet3DS::CHUNK_TRACKINFO)
            {
                mCurrentNode = pcNode;
                break;
            }
            pcNode->mInstanceCount++;
            instanceNumber = pcNode->mInstanceCount;
        }
        pcNode = new D3DS::Node(name);
        pcNode->mInstanceNumber = instanceNumber;

        // There are two unknown values which we can safely ignore
        stream->IncPtr(4);

        // Now read the hierarchy position of the object
        uint16_t hierarchy = stream->GetI2() + 1;
        pcNode->mHierarchyPos   = hierarchy;
        pcNode->mHierarchyIndex = mLastNodeIndex;

        // And find a proper position in the graph for it
        if (mCurrentNode && mCurrentNode->mHierarchyPos == hierarchy)   {

            // add to the parent of the last touched node
            mCurrentNode->mParent->push_back(pcNode);
            mLastNodeIndex++;
        }
        else if(hierarchy >= mLastNodeIndex)    {

            // place it at the current position in the hierarchy
            mCurrentNode->push_back(pcNode);
            mLastNodeIndex = hierarchy;
        }
        else    {
            // need to go back to the specified position in the hierarchy.
            InverseNodeSearch(pcNode,mCurrentNode);
            mLastNodeIndex++;
        }
        // Make this node the current node
        mCurrentNode = pcNode;
        }
        break;

    case Discreet3DS::CHUNK_TRACKDUMMYOBJNAME:

        // This is the "real" name of a $$$DUMMY object
        {
            const char* sz = (const char*) stream->GetPtr();
            while (stream->GetI1());

            // If object name is DUMMY, take this one instead
            if (mCurrentNode->mName == "$$$DUMMY")  {
                mCurrentNode->mName = std::string(sz);
                break;
            }
        }
        break;

    case Discreet3DS::CHUNK_TRACKPIVOT:

        if ( Discreet3DS::CHUNK_TRACKINFO != parent)
        {
            ASSIMP_LOG_WARN("3DS: Skipping pivot subchunk for non usual object");
            break;
        }

        // Pivot = origin of rotation and scaling
        mCurrentNode->vPivot.x = stream->GetF4();
        mCurrentNode->vPivot.y = stream->GetF4();
        mCurrentNode->vPivot.z = stream->GetF4();
        break;


        // ////////////////////////////////////////////////////////////////////
        // POSITION KEYFRAME
    case Discreet3DS::CHUNK_TRACKPOS:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        bool sortKeys = false;

        // This could also be meant as the target position for
        // (targeted) lights and cameras
        std::vector<aiVectorKey>* l;
        if ( Discreet3DS::CHUNK_TRACKCAMTGT == parent || Discreet3DS::CHUNK_TRACKLIGTGT == parent)  {
            l = & mCurrentNode->aTargetPositionKeys;
        }
        else l = & mCurrentNode->aPositionKeys;

        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiVectorKey v;
            v.mTime = (double)fidx;

            SkipTCBInfo();
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}

        break;

        // ////////////////////////////////////////////////////////////////////
        // CAMERA ROLL KEYFRAME
    case Discreet3DS::CHUNK_TRACKROLL:
        {
        // roll keys are accepted for cameras only
        if (parent != Discreet3DS::CHUNK_TRACKCAMERA)   {
            ASSIMP_LOG_WARN("3DS: Ignoring roll track for non-camera object");
            break;
        }
        bool sortKeys = false;
        std::vector<aiFloatKey>* l = &mCurrentNode->aCameraRollKeys;

        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiFloatKey v;
            v.mTime = (double)fidx;

            // This is just a single float
            SkipTCBInfo();
            v.mValue = stream->GetF4();

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiFloatKey>), l->end() );
        }}
        break;


        // ////////////////////////////////////////////////////////////////////
        // CAMERA FOV KEYFRAME
    case Discreet3DS::CHUNK_TRACKFOV:
        {
            ASSIMP_LOG_ERROR("3DS: Skipping FOV animation track. "
                "This is not supported");
        }
        break;


        // ////////////////////////////////////////////////////////////////////
        // ROTATION KEYFRAME
    case Discreet3DS::CHUNK_TRACKROTATE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();

        bool sortKeys = false;
        std::vector<aiQuatKey>* l = &mCurrentNode->aRotationKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            aiQuatKey v;
            v.mTime = (double)fidx;

            // The rotation keyframe is given as an axis-angle pair
            const float rad = stream->GetF4();
            aiVector3D axis;
            axis.x = stream->GetF4();
            axis.y = stream->GetF4();
            axis.z = stream->GetF4();

            if (!axis.x && !axis.y && !axis.z)
                axis.y = 1.f;

            // Construct a rotation quaternion from the axis-angle pair
            v.mValue = aiQuaternion(axis,rad);

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // add the new keyframe to the list
            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiQuatKey>), l->end() );
        }}
        break;

        // ////////////////////////////////////////////////////////////////////
        // SCALING KEYFRAME
    case Discreet3DS::CHUNK_TRACKSCALE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI2();
        stream->IncPtr(2);

        bool sortKeys = false;
        std::vector<aiVectorKey>* l = &mCurrentNode->aScalingKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            // Setup a new key
            aiVectorKey v;
            v.mTime = (double)fidx;

            // ... and read its value
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Remove zero-scalings on singular axes - they've been reported to be there erroneously in some strange files
            if (!v.mValue.x) v.mValue.x = 1.f;
            if (!v.mValue.y) v.mValue.y = 1.f;
            if (!v.mValue.z) v.mValue.z = 1.f;

            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}